

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Fl_Browser.cxx
# Opt level: O3

int __thiscall Fl_Browser::item_width(Fl_Browser *this,void *item)

{
  byte *pbVar1;
  char cVar2;
  byte bVar3;
  char *pcVar4;
  byte *pbVar5;
  ulong uVar6;
  byte bVar7;
  int *piVar8;
  int iVar9;
  int iVar10;
  ulong uVar11;
  double dVar12;
  byte *local_40;
  void *local_38;
  
  pbVar5 = (byte *)((long)item + 0x23);
  piVar8 = this->column_widths_;
  iVar9 = *piVar8;
  local_38 = item;
  if (iVar9 == 0) {
    iVar10 = 0;
  }
  else {
    cVar2 = this->column_char_;
    iVar10 = 0;
    do {
      piVar8 = piVar8 + 1;
      pcVar4 = strchr((char *)pbVar5,(int)cVar2);
      if (pcVar4 == (char *)0x0) break;
      pbVar5 = (byte *)(pcVar4 + 1);
      iVar10 = iVar10 + iVar9;
      iVar9 = *piVar8;
    } while (iVar9 != 0);
  }
  uVar11 = (ulong)(uint)(this->super_Fl_Browser_).textfont_;
  uVar6 = (ulong)(uint)(this->super_Fl_Browser_).textsize_;
  bVar7 = this->format_char_;
  local_40 = pbVar5;
  bVar3 = *pbVar5;
  if (*pbVar5 == bVar7) {
    do {
      bVar7 = bVar3;
      bVar3 = local_40[1];
      if ((bVar3 == 0) || (bVar3 == bVar7)) break;
      pbVar5 = local_40 + 2;
      if (bVar3 < 0x62) {
        switch(bVar3) {
        case 0x40:
          local_40 = local_40 + 1;
          goto LAB_001a62eb;
        case 0x41:
        case 0x44:
        case 0x45:
        case 0x47:
        case 0x48:
        case 0x49:
        case 0x4a:
        case 0x4b:
          break;
        case 0x42:
        case 0x43:
          pbVar5 = local_40 + 1;
          do {
            pbVar1 = pbVar5 + 1;
            pbVar5 = pbVar5 + 1;
          } while (*pbVar1 - 0x30 < 10);
          break;
        case 0x46:
          local_40 = pbVar5;
          uVar11 = strtol((char *)pbVar5,(char **)&local_40,10);
          pbVar5 = local_40;
          break;
        case 0x4c:
          goto switchD_001a621d_caseD_6c;
        case 0x4d:
          goto switchD_001a621d_caseD_6d;
        default:
          if (bVar3 == 0x53) {
            local_40 = pbVar5;
            uVar6 = strtol((char *)pbVar5,(char **)&local_40,10);
            pbVar5 = local_40;
          }
          else {
            local_40 = pbVar5;
            if (bVar3 == 0x2e) goto LAB_001a62eb;
          }
        }
      }
      else {
        switch(bVar3) {
        case 0x66:
        case 0x74:
          uVar11 = 4;
          break;
        case 0x67:
        case 0x68:
        case 0x6a:
        case 0x6b:
        case 0x6e:
        case 0x6f:
        case 0x70:
        case 0x71:
        case 0x72:
          break;
        case 0x69:
          uVar11 = (ulong)((uint)uVar11 | 2);
          break;
        case 0x6c:
switchD_001a621d_caseD_6c:
          uVar6 = 0x18;
          break;
        case 0x6d:
switchD_001a621d_caseD_6d:
          uVar6 = 0x12;
          break;
        case 0x73:
          uVar6 = 0xb;
          break;
        default:
          if (bVar3 == 0x62) {
            uVar11 = (ulong)((uint)uVar11 | 1);
          }
        }
      }
      local_40 = pbVar5;
      bVar7 = this->format_char_;
      bVar3 = *local_40;
    } while (*local_40 == bVar7);
  }
LAB_001a62eb:
  pbVar5 = local_40;
  if ((*local_40 == bVar7) && (local_40[1] != 0)) {
    pbVar5 = local_40 + 1;
  }
  if (iVar10 == 0) {
    if (*(long *)((long)local_38 + 0x18) == 0) {
      iVar10 = 0;
    }
    else {
      iVar10 = *(int *)(*(long *)((long)local_38 + 0x18) + 8);
    }
  }
  (*(fl_graphics_driver->super_Fl_Device)._vptr_Fl_Device[0x36])
            (fl_graphics_driver,uVar11 & 0xffffffff,uVar6 & 0xffffffff);
  dVar12 = fl_width((char *)pbVar5);
  return (int)dVar12 + iVar10 + 6;
}

Assistant:

int Fl_Browser::item_width(void *item) const {
  FL_BLINE* l=(FL_BLINE*)item;
  char* str = l->txt;
  const int* i = column_widths();
  int ww = 0;

  while (*i) { // add up all tab-separated fields
    char* e;
    e = strchr(str, column_char());
    if (!e) break; // last one occupied by text
    str = e+1;
    ww += *i++;
  }

  // OK, we gotta parse the string and find the string width...
  int tsize = textsize();
  Fl_Font font = textfont();
  int done = 0;

  while (*str == format_char_ && str[1] && str[1] != format_char_) {
    str ++;
    switch (*str++) {
    case 'l': case 'L': tsize = 24; break;
    case 'm': case 'M': tsize = 18; break;
    case 's': tsize = 11; break;
    case 'b': font = (Fl_Font)(font|FL_BOLD); break;
    case 'i': font = (Fl_Font)(font|FL_ITALIC); break;
    case 'f': case 't': font = FL_COURIER; break;
    case 'B':
    case 'C': while (isdigit(*str & 255)) str++; break; // skip a color number
    case 'F': font = (Fl_Font)strtol(str, &str, 10); break;
    case 'S': tsize = strtol(str, &str, 10); break;
    case '.':
      done = 1;
      break;
    case '@':
      str--;
      done = 1;
    }

    if (done)
      break;
  }

  if (*str == format_char_ && str[1])
    str ++;

  if (ww==0 && l->icon) ww = l->icon->w();

  fl_font(font, tsize);
  return ww + int(fl_width(str)) + 6;
}